

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O0

void la_miam_xon_ind_format_json(la_vstring *vstr,void *data)

{
  la_vstring *in_RSI;
  la_miam_xon_ind_msg *msg;
  la_vstring *vstr_00;
  
  vstr_00 = in_RSI;
  la_json_append_bool(in_RSI,(char *)in_RSI,false);
  if (*(short *)&in_RSI->str != 0xfff) {
    la_json_append_int64(vstr_00,(char *)in_RSI,0x17d53b);
  }
  la_json_append_int64(vstr_00,(char *)in_RSI,0x17d556);
  la_json_append_int64(vstr_00,(char *)in_RSI,0x17d571);
  return;
}

Assistant:

static void la_miam_xon_ind_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr);
	la_assert(data);

	la_miam_xon_ind_msg const *msg = data;
	la_json_append_bool(vstr, "all_files", msg->file_id == 0xFFF);
	if(msg->file_id != 0xFFF) {
		la_json_append_int64(vstr, "file_id", msg->file_id);
	}
	la_json_append_int64(vstr, "on_ground_seg_temp_secs", msg->onground_segment_tempo);
	la_json_append_int64(vstr, "in_flight_seg_temp_secs", msg->inflight_segment_tempo);
}